

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall tonk::SessionOutgoing::Flush(SessionOutgoing *this)

{
  bool bVar1;
  __int_type_conflict3 _Var2;
  uint8_t *puVar3;
  Allocator *in_RSI;
  SessionOutgoing *in_RDI;
  Result result_1;
  OutgoingQueuedDatagram *newCombined;
  Result compressResult;
  uint writtenBytes;
  uint syncOverhead;
  uint unreliableBytes;
  uint8_t *datagramData;
  uint datagramBytes;
  Locker locker_1;
  OutgoingQueuedDatagram *datagram_1;
  SiameseResult isReady;
  OutgoingQueue *queue;
  uint queueIndex;
  uint reliableOffset;
  bool prevCompressFailed;
  OutgoingQueuedDatagram *combined;
  Locker locker;
  bool isEmpty;
  OutgoingQueuedDatagram *datagram;
  OutgoingQueue *unreliableQueue;
  OutgoingQueuedDatagram *finalUnreliable;
  Result *result;
  uint headerWord_1;
  uint headerWord;
  Locker locker_9;
  Locker locker_5;
  Locker locker_2;
  Locker locker_11;
  Locker locker_10;
  Locker locker_7;
  Locker locker_4;
  Locker locker_3;
  uint neededBytes_2;
  Locker locker_12;
  uint neededBytes_1;
  Locker locker_8;
  uint neededBytes;
  Locker locker_6;
  Lock *in_stack_fffffffffffffb28;
  Result *in_stack_fffffffffffffb30;
  OutgoingQueue *in_stack_fffffffffffffb38;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *in_stack_fffffffffffffb40;
  uint uVar4;
  uint8_t *in_stack_fffffffffffffb48;
  Allocator *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  Allocator *in_stack_fffffffffffffb68;
  Allocator *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffbc0;
  uint in_stack_fffffffffffffbc4;
  OutgoingQueuedDatagram *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  uint in_stack_fffffffffffffbd4;
  uint8_t *in_stack_fffffffffffffbd8;
  MessageCompressor *in_stack_fffffffffffffbe0;
  OutgoingQueuedDatagram *in_stack_fffffffffffffc10;
  OutgoingQueuedDatagram *in_stack_fffffffffffffc18;
  SessionOutgoing *this_00;
  IIncomingToOutgoing local_3c8;
  byte local_3b9;
  uint8_t *local_3b8;
  IIncomingToOutgoing local_3b0;
  uint local_3a4;
  int local_3a0;
  uint local_39c;
  uint8_t *local_398;
  uint local_390;
  int local_38c;
  OutgoingQueuedDatagram *local_380;
  SiameseResult local_374;
  OutgoingQueue *local_370;
  uint local_364;
  uint local_360;
  byte local_359;
  uint8_t *local_358;
  byte local_331;
  OutgoingQueuedDatagram *local_330;
  OutgoingQueue *local_328;
  OutgoingQueuedDatagram *local_320;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  uint8_t *local_2f8;
  uint local_2ec;
  uint local_2e8;
  undefined4 local_2e4;
  uint8_t *local_2e0;
  undefined4 local_2bc;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_2b8;
  undefined4 local_294;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_290;
  undefined4 local_26c;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_268;
  uint8_t *local_260;
  uint8_t *local_258;
  uint8_t *local_250;
  undefined2 local_242;
  uint8_t *local_240;
  undefined2 local_232;
  uint8_t *local_230;
  OutgoingQueue *local_228;
  OutgoingQueue *local_220;
  OutgoingQueuedDatagram *local_218;
  OutgoingQueuedDatagram *local_208;
  WindowHeader *local_1f8;
  uint8_t *local_1d8;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_1d0;
  OutgoingQueuedDatagram *local_1b0;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_1a8;
  OutgoingQueuedDatagram *local_188;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_180;
  OutgoingQueuedDatagram *local_160;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_158;
  OutgoingQueuedDatagram *local_138;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_130;
  IIncomingToOutgoing *local_128;
  IIncomingToOutgoing *local_118;
  IIncomingToOutgoing *local_110;
  IIncomingToOutgoing *local_100;
  int local_f0;
  uint local_ec;
  uint8_t *local_e8;
  int local_b4;
  uint8_t *local_b0;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_a8;
  int local_a0;
  uint local_9c;
  uint8_t *local_98;
  IIncomingToOutgoing *local_88;
  int local_64;
  uint8_t *local_60;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_58;
  int local_50;
  uint local_4c;
  uint8_t *local_48;
  int local_14;
  uint8_t *local_10;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *local_8;
  
  this_00 = in_RDI;
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffb38);
  if (bVar1) {
    local_320 = (OutgoingQueuedDatagram *)0x0;
    local_328 = (OutgoingQueue *)(in_RSI[1].FullWindows.PreallocatedData + 0xd);
    local_220 = local_328;
    if (*(int *)(in_RSI[1].FullWindows.PreallocatedData + 0x11) != 0) {
      while( true ) {
        local_331 = 1;
        Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        in_stack_fffffffffffffc18 = OutgoingQueue::FlushPeek(in_stack_fffffffffffffb38);
        local_330 = in_stack_fffffffffffffc18;
        if (in_stack_fffffffffffffc18 != (OutgoingQueuedDatagram *)0x0) {
          local_331 = OutgoingQueue::PopIsEmpty(local_328);
        }
        Locker::~Locker((Locker *)0x1e1613);
        if (local_330 == (OutgoingQueuedDatagram *)0x0) goto LAB_001e167c;
        if ((local_331 & 1) != 0) break;
        local_208 = local_330;
        sendQueuedDatagram(this_00,in_stack_fffffffffffffc18,
                           (uint)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                           (uint)in_stack_fffffffffffffc10);
      }
      local_320 = local_330;
    }
LAB_001e167c:
    local_358 = (uint8_t *)0x0;
    local_359 = 0;
    local_360 = 0;
    for (local_364 = 1; uVar4 = (uint)((ulong)in_stack_fffffffffffffb40 >> 0x20), local_364 < 4;
        local_364 = local_364 + 1) {
      local_370 = (OutgoingQueue *)
                  (in_RSI[1].FullWindows.PreallocatedData + (ulong)local_364 * 5 + 0xd);
      local_228 = local_370;
      if (local_370->QueuedBytes != 0) {
LAB_001e16fd:
        do {
          if (1 < local_364) {
            local_1f8 = in_RSI[1].PreferredWindows.PreallocatedData[10];
            _Var2 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffffb38);
            uVar4 = (uint)((ulong)in_stack_fffffffffffffb40 >> 0x20);
            if (_Var2 < 1) goto LAB_001e273c;
          }
          local_374 = siamese_encoder_is_ready
                                ((SiameseEncoder)in_RSI[1].FullWindows.PreallocatedData[4]);
          uVar4 = (uint)((ulong)in_stack_fffffffffffffb40 >> 0x20);
          if (local_374 != Siamese_Success) goto LAB_001e273c;
          Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
          in_stack_fffffffffffffc10 = OutgoingQueue::FlushPeek(in_stack_fffffffffffffb38);
          local_380 = in_stack_fffffffffffffc10;
          if (in_stack_fffffffffffffc10 == (OutgoingQueuedDatagram *)0x0) {
            local_38c = 7;
          }
          else {
            OutgoingQueue::PopIsEmpty(local_370);
            local_38c = 0;
          }
          Locker::~Locker((Locker *)0x1e180b);
          if (local_38c != 0) break;
          local_390 = local_380->NextWriteOffset;
          local_398 = local_380->Data;
          if (local_358 == (uint8_t *)0x0) {
            local_268 = &in_RSI->PreferredWindows;
            local_26c = 0xa8c;
            Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
            puVar3 = pktalloc::Allocator::Allocate
                               (in_stack_fffffffffffffb70,
                                (uint)((ulong)in_stack_fffffffffffffb68 >> 0x20));
            Locker::~Locker((Locker *)0x1e18f3);
            local_358 = puVar3;
            if (puVar3 == (uint8_t *)0x0) {
              Result::OutOfMemory();
              return (Result)(ErrorResult *)in_RDI;
            }
            puVar3[0] = '\0';
            puVar3[1] = '\0';
            puVar3[2] = '\0';
            puVar3[3] = '\0';
            puVar3[4] = '\0';
            puVar3[5] = '\0';
            puVar3[6] = '\0';
            puVar3[7] = '\0';
            puVar3[8] = '\0';
            puVar3[9] = '\0';
            puVar3[10] = '\0';
            puVar3[0xb] = '\0';
            puVar3[0xc] = '\0';
            puVar3[0xd] = '\0';
            puVar3[0xe] = '\0';
            puVar3[0xf] = '\0';
            local_250 = puVar3;
            if (local_320 != (OutgoingQueuedDatagram *)0x0) {
              local_39c = local_320->NextWriteOffset;
              local_360 = local_39c;
              memcpy(puVar3 + 0x10,local_320->Data,(ulong)local_39c);
              *(uint *)(local_358 + 8) = local_39c;
              local_130 = &in_RSI->PreferredWindows;
              local_138 = local_320;
              Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
              pktalloc::Allocator::Free
                        (in_stack_fffffffffffffb68,
                         (uint8_t *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
              Locker::~Locker((Locker *)0x1e1a53);
              local_320 = (OutgoingQueuedDatagram *)0x0;
            }
          }
          uVar4 = (uint)((ulong)in_stack_fffffffffffffb40 >> 0x20);
          local_3a0 = 0;
          if ((1 < local_364) && (((ulong)in_RSI[1].PreferredWindows.PreallocatedData[6] & 1) != 0))
          {
            local_3a4 = 0;
            MessageCompressor::Compress
                      (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4
                       ,(uint8_t *)in_stack_fffffffffffffbc8,
                       (uint *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0));
            local_118 = &local_3b0;
            if (local_3b0._vptr_IIncomingToOutgoing == (_func_int **)0x0) {
              if (local_3a4 == 0) {
                if ((local_359 & 1) != 0) {
                  local_3a0 = 2;
                }
                local_359 = 1;
                local_38c = 0;
              }
              else {
                local_2e0 = local_358 + (ulong)*(uint *)(local_358 + 8) + 0x10;
                local_2e4 = 5;
                local_2e8 = local_3a4;
                local_2ec = local_3a4 | 0x2800;
                local_242 = (undefined2)local_2ec;
                *(undefined2 *)local_2e0 = local_242;
                local_3a4 = local_3a4 + 2;
                local_359 = 0;
                local_240 = local_2e0;
                if (*(uint *)(in_RSI[1].PreferredWindows.PreallocatedData + 5) <
                    *(int *)(local_358 + 8) + local_3a4) {
                  local_290 = &in_RSI->PreferredWindows;
                  local_294 = 0xa8c;
                  Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
                  puVar3 = pktalloc::Allocator::Allocate
                                     (in_stack_fffffffffffffb70,
                                      (uint)((ulong)in_stack_fffffffffffffb68 >> 0x20));
                  Locker::~Locker((Locker *)0x1e1e6f);
                  local_3b8 = puVar3;
                  if (puVar3 == (uint8_t *)0x0) {
                    Result::OutOfMemory();
                    local_38c = 1;
                  }
                  else {
                    puVar3[0] = '\0';
                    puVar3[1] = '\0';
                    puVar3[2] = '\0';
                    puVar3[3] = '\0';
                    puVar3[4] = '\0';
                    puVar3[5] = '\0';
                    puVar3[6] = '\0';
                    puVar3[7] = '\0';
                    puVar3[8] = '\0';
                    puVar3[9] = '\0';
                    puVar3[10] = '\0';
                    puVar3[0xb] = '\0';
                    puVar3[0xc] = '\0';
                    puVar3[0xd] = '\0';
                    puVar3[0xe] = '\0';
                    puVar3[0xf] = '\0';
                    local_258 = puVar3;
                    memcpy(puVar3 + 0x10,local_358 + (ulong)*(uint *)(local_358 + 8) + 0x10,
                           (ulong)local_3a4);
                    *(uint *)(local_3b8 + 8) = local_3a4;
                    *(uint *)(local_3b8 + 0xc) = (local_390 - local_3a4) + 2;
                    local_3b9 = 0;
                    local_48 = local_358;
                    local_4c = local_360;
                    local_50 = *(int *)(local_358 + 8) + 0x3f;
                    local_8 = &in_RSI->PreferredWindows;
                    local_10 = local_358;
                    local_14 = local_50;
                    Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
                    pktalloc::Allocator::Shrink
                              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                               (uint)((ulong)in_stack_fffffffffffffb40 >> 0x20));
                    Locker::~Locker((Locker *)0x1e204e);
                    sendQueuedReliable((SessionOutgoing *)
                                       CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0)
                                       ,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4);
                    if ((this_00->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing ==
                        (_func_int **)0x0) {
                      local_358 = local_3b8;
                      local_360 = 0;
                      local_180 = &in_RSI->PreferredWindows;
                      local_188 = local_380;
                      Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
                      pktalloc::Allocator::Free
                                (in_stack_fffffffffffffb68,
                                 (uint8_t *)
                                 CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
                      Locker::~Locker((Locker *)0x1e21b1);
                      local_38c = 8;
                    }
                    else {
                      local_3b9 = 1;
                      local_38c = 1;
                    }
                    if ((local_3b9 & 1) == 0) {
                      Result::~Result(in_stack_fffffffffffffb30);
                    }
                  }
                }
                else {
                  *(uint *)(local_358 + 8) = *(int *)(local_358 + 8) + local_3a4;
                  *(uint *)(local_358 + 0xc) =
                       (local_390 - local_3a4) + 2 + *(int *)(local_358 + 0xc);
                  local_158 = &in_RSI->PreferredWindows;
                  local_160 = local_380;
                  Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
                  pktalloc::Allocator::Free
                            (in_stack_fffffffffffffb68,
                             (uint8_t *)
                             CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
                  Locker::~Locker((Locker *)0x1e1dae);
                  local_38c = 8;
                }
              }
            }
            else {
              local_110 = &local_3b0;
              (this_00->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing =
                   local_3b0._vptr_IIncomingToOutgoing;
              local_3b0._vptr_IIncomingToOutgoing = (_func_int **)0x0;
              local_38c = 1;
            }
            Result::~Result(in_stack_fffffffffffffb30);
            uVar4 = (uint)((ulong)in_stack_fffffffffffffb40 >> 0x20);
            if (local_38c != 0) {
              if (local_38c == 1) {
                return (Result)(ErrorResult *)in_RDI;
              }
              goto LAB_001e16fd;
            }
          }
          if (*(uint *)(in_RSI[1].PreferredWindows.PreallocatedData + 5) <
              *(int *)(local_358 + 8) + local_390 + local_3a0) {
            local_88 = &local_3c8;
            local_98 = local_358;
            local_9c = local_360;
            local_a0 = *(int *)(local_358 + 8) + 0x3f;
            in_stack_fffffffffffffb70 = (Allocator *)&in_RSI->PreferredWindows;
            local_60 = local_358;
            in_stack_fffffffffffffb68 = in_RSI;
            local_64 = local_a0;
            local_58 = (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)
                       in_stack_fffffffffffffb70;
            Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
            pktalloc::Allocator::Shrink(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,uVar4);
            Locker::~Locker((Locker *)0x1e2378);
            sendQueuedReliable((SessionOutgoing *)
                               CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                               in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4);
            local_128 = &local_3c8;
            in_stack_fffffffffffffb67 = local_3c8._vptr_IIncomingToOutgoing != (_func_int **)0x0;
            if ((bool)in_stack_fffffffffffffb67) {
              local_100 = &local_3c8;
              (this_00->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing =
                   local_3c8._vptr_IIncomingToOutgoing;
              local_3c8._vptr_IIncomingToOutgoing = (_func_int **)0x0;
              local_38c = 1;
            }
            else {
              in_stack_fffffffffffffb50 = (Allocator *)&in_RSI->PreferredWindows;
              local_2bc = 0xa8c;
              local_2b8 = (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)
                          in_stack_fffffffffffffb50;
              Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
              in_stack_fffffffffffffb48 =
                   pktalloc::Allocator::Allocate
                             (in_stack_fffffffffffffb70,
                              (uint)((ulong)in_stack_fffffffffffffb68 >> 0x20));
              Locker::~Locker((Locker *)0x1e24fb);
              local_358 = in_stack_fffffffffffffb48;
              if (in_stack_fffffffffffffb48 == (uint8_t *)0x0) {
                Result::OutOfMemory();
                local_38c = 1;
              }
              else {
                in_stack_fffffffffffffb48[0] = '\0';
                in_stack_fffffffffffffb48[1] = '\0';
                in_stack_fffffffffffffb48[2] = '\0';
                in_stack_fffffffffffffb48[3] = '\0';
                in_stack_fffffffffffffb48[4] = '\0';
                in_stack_fffffffffffffb48[5] = '\0';
                in_stack_fffffffffffffb48[6] = '\0';
                in_stack_fffffffffffffb48[7] = '\0';
                in_stack_fffffffffffffb48[8] = '\0';
                in_stack_fffffffffffffb48[9] = '\0';
                in_stack_fffffffffffffb48[10] = '\0';
                in_stack_fffffffffffffb48[0xb] = '\0';
                in_stack_fffffffffffffb48[0xc] = '\0';
                in_stack_fffffffffffffb48[0xd] = '\0';
                in_stack_fffffffffffffb48[0xe] = '\0';
                in_stack_fffffffffffffb48[0xf] = '\0';
                local_360 = 0;
                local_359 = 0;
                local_3a0 = 0;
                local_38c = 0;
                local_260 = in_stack_fffffffffffffb48;
              }
            }
            Result::~Result(in_stack_fffffffffffffb30);
            if (local_38c != 0) {
              return (Result)(ErrorResult *)in_RDI;
            }
          }
          if (local_3a0 != 0) {
            local_2f8 = local_358 + (ulong)*(uint *)(local_358 + 8) + 0x10;
            local_2fc = 5;
            local_300 = 0;
            local_304 = 0x2800;
            local_232 = 0x2800;
            local_2f8[0] = '\0';
            local_2f8[1] = '(';
            *(int *)(local_358 + 8) = *(int *)(local_358 + 8) + 2;
            local_230 = local_2f8;
          }
          memcpy(local_358 + (ulong)*(uint *)(local_358 + 8) + 0x10,local_398,(ulong)local_390);
          *(uint *)(local_358 + 8) = *(int *)(local_358 + 8) + local_390;
          in_stack_fffffffffffffb40 = &in_RSI->PreferredWindows;
          local_1b0 = local_380;
          local_1a8 = in_stack_fffffffffffffb40;
          Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
          pktalloc::Allocator::Free
                    (in_stack_fffffffffffffb68,
                     (uint8_t *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
          Locker::~Locker((Locker *)0x1e271d);
        } while( true );
      }
    }
LAB_001e273c:
    if (local_320 != (OutgoingQueuedDatagram *)0x0) {
      local_218 = local_320;
      sendQueuedDatagram(this_00,in_stack_fffffffffffffc18,
                         (uint)((ulong)in_stack_fffffffffffffc10 >> 0x20),
                         (uint)in_stack_fffffffffffffc10);
    }
    if (local_358 == (uint8_t *)0x0) {
      Result::Success();
    }
    else if (*(int *)(local_358 + 8) == 0) {
      local_1d0 = &in_RSI->PreferredWindows;
      local_1d8 = local_358;
      Locker::Locker((Locker *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      pktalloc::Allocator::Free
                (in_stack_fffffffffffffb68,
                 (uint8_t *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      Locker::~Locker((Locker *)0x1e2848);
      Result::Success();
    }
    else {
      local_e8 = local_358;
      local_ec = local_360;
      local_f0 = *(int *)(local_358 + 8) + 0x3f;
      local_a8 = &in_RSI->PreferredWindows;
      local_b0 = local_358;
      local_b4 = local_f0;
      Locker::Locker((Locker *)local_a8,(Lock *)in_RSI);
      pktalloc::Allocator::Shrink(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,uVar4);
      Locker::~Locker((Locker *)0x1e295c);
      sendQueuedReliable((SessionOutgoing *)
                         CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                         in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc4);
    }
  }
  else {
    Result::Success();
  }
  return (Result)(ErrorResult *)in_RDI;
}

Assistant:

Result SessionOutgoing::Flush()
{
    // Note: There are a number of failure paths that leak objects.
    // This seems okay since in response to the error we disconnect,
    // and all of these allocations get automatically freed afterwards

    // If peer address is not known yet:
    if (!HasPeerAddress) {
        return Result::Success();
    }

    // Try to combine the last unreliable frames with the first reliable frames
    OutgoingQueuedDatagram* finalUnreliable = nullptr;

    // For the unreliable queue:

    OutgoingQueue* unreliableQueue = &Queues[Queue_Unreliable];

    // Quick skip for common case with no data waiting:
    if (unreliableQueue->GetQueuedBytes() > 0)
    // For all datagrams for this queue:
    for (;;)
    {
        // Grab next datagram from queue (if any)
        OutgoingQueuedDatagram* datagram;
        bool isEmpty = true;
        {
            Locker locker(OutgoingQueueLock);

            // Look at the next datagram
            datagram = unreliableQueue->FlushPeek();

            if (datagram) {
                // Pop it off the front
                isEmpty = unreliableQueue->PopIsEmpty();
            }
        }

        if (!datagram) {
            // Continue on to reliable queued data
            break;
        }

        TONK_DEBUG_ASSERT(datagram->NextWriteOffset > 0);

        if (isEmpty) {
            finalUnreliable = datagram;
            break;
        }

        // There are more to send- send this one now
        sendQueuedUnreliable(datagram);
    } // Next datagram in queue

    // Combine datagrams together if compression works well enough
    OutgoingQueuedDatagram* combined = nullptr;

    // Separate failed compression buffers with an empty compression frame
    bool prevCompressFailed = false;

    // Offset to reliable data
    unsigned reliableOffset = 0;

    // Send Reliable queue first and then LowPri queue datagrams
    for (unsigned queueIndex = Queue_Unmetered; queueIndex < Queue_Count; ++queueIndex)
    {
        OutgoingQueue* queue = &Queues[queueIndex];

        // Quick skip for common case with no data waiting:
        if (queue->GetQueuedBytes() <= 0) {
            continue;
        }

        // For all datagrams for this queue:
        for (;;)
        {
            // If this is a Reliable or LowPri message:
            if (queueIndex >= Queue_Reliable) {
                // If there is no space left:
                if (Deps.SenderControl->GetAvailableBytes() <= 0) {
                    goto DoneSending;
                }
            }

            const SiameseResult isReady = siamese_encoder_is_ready(FECEncoder);
            if (isReady != Siamese_Success) {
                //Deps.Logger->Warning("SiameseFEC not ready for more data. Delaying sending more until some data is acknowledged");
                goto DoneSending;
            }

            // Grab next datagram from queue (if any)
            // TBD: This lock is a little heavy - Sometimes it waits for
            // a queue insertion to finish.  It would be nicer if we flushed
            // just once at the top of the Flush() and then pulled results
            // off the protected queue a bit faster.
            OutgoingQueuedDatagram* datagram;
            {
                Locker locker(OutgoingQueueLock);
                datagram = queue->FlushPeek();
                if (!datagram) {
                    // Done with this queue
                    break;
                }
                queue->PopIsEmpty();
            }

            const unsigned datagramBytes = datagram->NextWriteOffset;
            const uint8_t* datagramData = datagram->Data;

            // TBD: Always allocate the combining buffer even if it is just one unordered message
            // TBD: We could be compressing directly into this buffer in some cases
            if (!combined)
            {
                combined = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
                    protocol::kMaxPossibleDatagramByteLimit * 2);
                if (!combined) {
                    return Result::OutOfMemory();
                }
                combined->Initialize();

                // If there was some unreliable message data to combine:
                if (finalUnreliable)
                {
                    // Indicate that the reliable data starts at an offset
                    const unsigned unreliableBytes = finalUnreliable->NextWriteOffset;
                    reliableOffset = unreliableBytes;

                    // Combine final unreliable messages with first reliable messages
                    memcpy(combined->Data, finalUnreliable->Data, unreliableBytes);
                    combined->NextWriteOffset = unreliableBytes;

#ifdef TONK_DETAILED_STATS
                    combined->AccumulateStats(finalUnreliable);
#endif // TONK_DETAILED_STATS

                    // Prevent this from running again
                    WriteAllocator.Free(finalUnreliable);
                    finalUnreliable = nullptr;
                } // End if there was a final unreliable message to combine
            } // End if no 'combined' buffer allocated yet

            unsigned syncOverhead = 0;

            // If the data is in a reliable-in-order queue and compression is enabled:
            if (queueIndex > Queue_Unmetered && Deps.EnableCompression)
            {
                unsigned writtenBytes = 0;

                // Compress datagram to scratch space
                const Result compressResult = Compressor.Compress(
                    datagramData,
                    datagramBytes,
                    combined->Data + combined->NextWriteOffset + protocol::kMessageFrameBytes,
                    writtenBytes);
                if (compressResult.IsFail()) {
                    return compressResult;
                }

                // If compression succeeded:
                if (writtenBytes > 0)
                {
                    TONK_DEBUG_ASSERT(writtenBytes < datagramBytes);

                    // Write Compressed frame header
                    protocol::WriteMessageFrameHeader(
                        combined->Data + combined->NextWriteOffset,
                        protocol::MessageType_Compressed,
                        writtenBytes);
                    writtenBytes += protocol::kMessageFrameBytes;

                    // Clear previous compression failure
                    prevCompressFailed = false;

                    // If there is enough space to keep it in the combined datagram:
                    if (combined->NextWriteOffset + writtenBytes <= MaxMessageSectionBytes)
                    {
                        // Data is already in-place
                        combined->NextWriteOffset += writtenBytes;

                        // Keep track of compression savings
                        combined->CompressionSavings += datagramBytes + protocol::kMessageFrameBytes - writtenBytes;

#ifdef TONK_DETAILED_STATS
                        // TBD: Do not keep the original reliable message breakdown.
                        // Replace those counters with the smaller compressed sent byte count
                        combined->Stats[Stats_CompressedBytesSent] += writtenBytes - protocol::kMessageFrameBytes;
                        combined->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
                        combined->Stats[Stats_CompressionSavedBytes] += datagramBytes;
#endif // TONK_DETAILED_STATS

                        WriteAllocator.Free(datagram);
                        continue;
                    }

                    // Move the compressed data to a new combined datagram:

                    OutgoingQueuedDatagram* newCombined = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
                        protocol::kMaxPossibleDatagramByteLimit * 2);
                    if (!newCombined) {
                        return Result::OutOfMemory();
                    }
                    newCombined->Initialize();

                    memcpy(newCombined->Data, combined->Data + combined->NextWriteOffset, writtenBytes);
                    newCombined->NextWriteOffset = writtenBytes;

                    // Keep track of compression savings
                    newCombined->CompressionSavings = datagramBytes + protocol::kMessageFrameBytes - writtenBytes;

                    const Result result = shrinkWrapAndSendReliable(combined, reliableOffset);
                    if (result.IsFail()) {
                        return result;
                    }

                    combined = newCombined;
                    reliableOffset = 0;

#ifdef TONK_DETAILED_STATS
                    // TBD: Do not keep the original reliable message breakdown.
                    // Replace those counters with the smaller compressed sent byte count
                    combined->Stats[Stats_CompressedBytesSent] += writtenBytes - protocol::kMessageFrameBytes;
                    combined->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
#endif // TONK_DETAILED_STATS

                    WriteAllocator.Free(datagram);
                    continue;
                } // End if compression succeeded

                // If previous compression failed too:
                if (prevCompressFailed) {
                    // Receiver will need a frame injected to know where the
                    // buffer split is at.
                    syncOverhead = protocol::kMessageFrameBytes;
                }

                prevCompressFailed = true;
            } // End if compression should be attempted
            else {
                TONK_DEBUG_ASSERT(!prevCompressFailed); // Should not have compressed anything yet
            }

            // If there is not enough space:
            if (combined->NextWriteOffset + datagramBytes + syncOverhead > MaxMessageSectionBytes)
            {
                const Result result = shrinkWrapAndSendReliable(combined, reliableOffset);
                if (result.IsFail()) {
                    return result;
                }

                combined = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
                    protocol::kMaxPossibleDatagramByteLimit * 2);
                if (!combined) {
                    return Result::OutOfMemory();
                }
                combined->Initialize();

                // All data is reliable after the first reliable datagram
                reliableOffset = 0;

                // Reset the compression failed flag
                prevCompressFailed = false;
                syncOverhead = 0;
            }

            // If we need to write a frame to synchronize compression history:
            if (syncOverhead != 0)
            {
                // See the "Why a Sync Frame is Needed" note in the
                // PacketCompression.h header for why this is needed.
                protocol::WriteMessageFrameHeader(
                    combined->Data + combined->NextWriteOffset,
                    protocol::MessageType_Compressed,
                    0);

#ifdef TONK_DETAILED_STATS
                combined->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
#endif // TONK_DETAILED_STATS

                combined->NextWriteOffset += protocol::kMessageFrameBytes;
            } // End if adding sync frame

            // Copy the datagram or compressed data to the end of the combined buffer
            memcpy(
                combined->Data + combined->NextWriteOffset,
                datagramData,
                datagramBytes);

            combined->NextWriteOffset += datagramBytes;

#ifdef TONK_DETAILED_STATS
            combined->AccumulateStats(datagram);
#endif // TONK_DETAILED_STATS

            WriteAllocator.Free(datagram);
        } // Next datagram in queue
    } // Next priority queue

DoneSending:

    // If we have still not sent the final unreliable datagram:
    if (finalUnreliable) {
        sendQueuedUnreliable(finalUnreliable);
    }

    if (!combined) {
        return Result::Success();
    }

    // If we allocated a buffer we didn't end up needing:
    if (combined->NextWriteOffset <= 0)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        WriteAllocator.Free(combined);
        return Result::Success();
    }
    // Otherwise this will send at least one empty datagram during handshaking

    return shrinkWrapAndSendReliable(combined, reliableOffset);
}